

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  bool bVar2;
  Code _colourCode;
  undefined1 local_48 [56];
  AssertionPrinter *pAStack_10;
  Colour colour;
  AssertionPrinter *this_local;
  
  pAStack_10 = this;
  bVar2 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar2) {
    _colourCode = dimColour();
    Colour::Colour((Colour *)(local_48 + 0x37),_colourCode);
    std::operator<<((ostream *)this->stream," for: ");
    Colour::~Colour((Colour *)(local_48 + 0x37));
    poVar1 = (ostream *)this->stream;
    AssertionResult::getExpandedExpression_abi_cxx11_((AssertionResult *)local_48);
    std::operator<<(poVar1,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    {
                        Colour colour( dimColour() );
                        stream << " for: ";
                    }
                    stream << result.getExpandedExpression();
                }
            }